

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u64 filterHash(Mem *aMem,Op *pOp)

{
  int iVar1;
  Mem *pMem;
  i64 iVar2;
  Mem *p;
  u64 h;
  int mx;
  int i;
  Op *pOp_local;
  Mem *aMem_local;
  
  p = (Mem *)0x0;
  h._4_4_ = pOp->p3;
  iVar1 = h._4_4_ + (pOp->p4).i;
  for (; h._4_4_ < iVar1; h._4_4_ = h._4_4_ + 1) {
    pMem = aMem + h._4_4_;
    if ((pMem->flags & 0x24) == 0) {
      if ((pMem->flags & 8) == 0) {
        if (((pMem->flags & 0x12) != 0) &&
           (p = (Mem *)((long)&p->u + (long)pMem->n), (pMem->flags & 0x400) != 0)) {
          p = (Mem *)((long)&p->u + (long)(pMem->u).nZero);
        }
      }
      else {
        iVar2 = sqlite3VdbeIntValue(pMem);
        p = (Mem *)((long)&p->u + iVar2);
      }
    }
    else {
      p = (Mem *)((long)&p->u + (long)(pMem->u).zPType);
    }
  }
  return (u64)p;
}

Assistant:

static u64 filterHash(const Mem *aMem, const Op *pOp){
  int i, mx;
  u64 h = 0;

  assert( pOp->p4type==P4_INT32 );
  for(i=pOp->p3, mx=i+pOp->p4.i; i<mx; i++){
    const Mem *p = &aMem[i];
    if( p->flags & (MEM_Int|MEM_IntReal) ){
      h += p->u.i;
    }else if( p->flags & MEM_Real ){
      h += sqlite3VdbeIntValue(p);
    }else if( p->flags & (MEM_Str|MEM_Blob) ){
      h += p->n;
      if( p->flags & MEM_Zero ) h += p->u.nZero;
    }
  }
  return h;
}